

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  size_t *psVar1;
  factory *pfVar2;
  _data *this_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  legacy_sync_pool *__p;
  _Node *p_Var4;
  shared_ptr<cppcms::application_specific_pool> p;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<cppcms::application_specific_pool> local_90;
  application_specific_pool *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  unique_lock<std::recursive_mutex> local_70;
  attachment local_60;
  
  __p = (legacy_sync_pool *)operator_new(0x28);
  pfVar2 = *(factory **)__special_file;
  __special_file[0] = '\0';
  __special_file[1] = '\0';
  __special_file[2] = '\0';
  __special_file[3] = '\0';
  __special_file[4] = '\0';
  __special_file[5] = '\0';
  __special_file[6] = '\0';
  __special_file[7] = '\0';
  application_specific_pool::application_specific_pool((application_specific_pool *)__p);
  (__p->super_application_specific_pool)._vptr_application_specific_pool =
       (_func_int **)&PTR__legacy_sync_pool_00285af0;
  (__p->fact_)._M_t.
  super___uniq_ptr_impl<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
  .super__Head_base<0UL,_cppcms::applications_pool::factory_*,_false>._M_head_impl = pfVar2;
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::legacy_sync_pool,void>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&local_80
             ,__p);
  ((local_80->d).ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(local_80,0x8000);
  local_70._M_device = &((this->d).ptr_)->lock;
  local_70._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  local_70._M_owns = true;
  this_00 = (this->d).ptr_;
  local_90.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_80;
  local_90.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_78;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  _data::attachment::attachment(&local_60,&local_90,(mount_point *)__dir);
  p_Var4 = std::__cxx11::
           list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ::_M_create_node<cppcms::applications_pool::_data::attachment>(&this_00->apps,&local_60);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(this_00->apps).
            super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_60.pool.
      super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.pool.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  mount_point::~mount_point(&local_60.mp);
  if (local_90.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  iVar3 = extraout_EAX;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    iVar3 = extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

void applications_pool::mount(std::unique_ptr<factory> aps,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_sync_pool(std::move(aps)));
	p->size(d->thread_count);
	p->flags(app::legacy);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->apps.push_back(_data::attachment(p,mp));
}